

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

void __thiscall cnn::ComputationGraph::set_dim_for_new_node(ComputationGraph *this,VariableIndex *i)

{
  bool bVar1;
  uint *puVar2;
  reference ppNVar3;
  reference t_;
  reference __dest;
  VariableIndex *in_RSI;
  allocator_type *in_RDI;
  VariableIndex arg;
  iterator __end1;
  iterator __begin1;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range1;
  uint ai;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> xds;
  Node *node;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *in_stack_ffffffffffffff38;
  Dim *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  undefined1 local_88 [36];
  VariableIndex local_64;
  VariableIndex *local_60;
  __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
  local_58;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *local_50;
  uint local_48;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> local_30;
  value_type local_18;
  
  puVar2 = VariableIndex::operator_cast_to_unsigned_int_(in_RSI);
  ppNVar3 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::operator[]
                      ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_RDI,(ulong)*puVar2);
  local_18 = *ppNVar3;
  Node::arity((Node *)0x3adbf7);
  std::allocator<cnn::Dim>::allocator((allocator<cnn::Dim> *)0x3adc10);
  std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::vector
            ((vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)in_RDI,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50);
  std::allocator<cnn::Dim>::~allocator((allocator<cnn::Dim> *)0x3adc36);
  local_48 = 0;
  local_50 = &local_18->args;
  local_58._M_current =
       (VariableIndex *)
       std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                 (in_stack_ffffffffffffff38);
  local_60 = (VariableIndex *)
             std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                       (in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    t_ = __gnu_cxx::
         __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
         ::operator*(&local_58);
    in_stack_ffffffffffffff50 = in_RDI;
    VariableIndex::VariableIndex(&local_64,t_);
    in_RDI = in_stack_ffffffffffffff50;
    puVar2 = VariableIndex::operator_cast_to_unsigned_int_(&local_64);
    ppNVar3 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::operator[]
                        ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                         in_stack_ffffffffffffff50,(ulong)*puVar2);
    in_stack_ffffffffffffff40 = &(*ppNVar3)->dim;
    __dest = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](&local_30,(ulong)local_48)
    ;
    memcpy(__dest,in_stack_ffffffffffffff40,0x24);
    local_48 = local_48 + 1;
    __gnu_cxx::
    __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
    ::operator++(&local_58);
  }
  (*local_18->_vptr_Node[2])(local_88,local_18,&local_30);
  memcpy(&local_18->dim,local_88,0x24);
  std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::~vector
            ((vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)in_stack_ffffffffffffff50);
  return;
}

Assistant:

void ComputationGraph::set_dim_for_new_node(const VariableIndex& i) {
  Node* node = nodes[i];
  vector<Dim> xds(node->arity());
  unsigned ai = 0;
  for (VariableIndex arg : node->args) {
    xds[ai] = nodes[arg]->dim;
    ++ai;
  }
  node->dim = node->dim_forward(xds);
}